

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbuffer.c
# Opt level: O1

void bounded_buffer_cleanup(bounded_buffer_t *bb)

{
  long lVar1;
  int iVar2;
  
  if ((long)bb->size < 1) {
    iVar2 = 0;
  }
  else {
    lVar1 = 0;
    iVar2 = 0;
    do {
      iVar2 = (iVar2 + 1) - (uint)(bb->entries[lVar1] == (entry_t *)0x0);
      lVar1 = lVar1 + 1;
    } while (bb->size != lVar1);
  }
  if (0 < iVar2) {
    fprintf(_stderr,
            "\x1b[0;32m[INFO]    %s (%s:%d) \x1b[0mWarning: %d entries in bounded buffer not freed\n\n"
            ,"bounded_buffer_cleanup",
            "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/bounded-buffer/bbuffer.c"
            ,0x3e);
  }
  free(bb->entries);
  pthread_mutex_destroy((pthread_mutex_t *)&bb->lock);
  pthread_cond_destroy((pthread_cond_t *)&bb->has_space);
  pthread_cond_destroy((pthread_cond_t *)&bb->has_items);
  return;
}

Assistant:

void bounded_buffer_cleanup(bounded_buffer_t* bb)
{
    int unfreed_count = 0;
    for (int i=0; i < bb->size; i++)
        if (bb->entries[i] != NULL)
            unfreed_count++;
    if (unfreed_count > 0)
    {
        lwlog_info("Warning: %d entries in bounded buffer not freed\n", unfreed_count);
    }
    free(bb->entries);
    pthread_mutex_destroy(&bb->lock);
    pthread_cond_destroy(&bb->has_space);
    pthread_cond_destroy(&bb->has_items);
}